

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

lword readsection(GlobalVars *gv,uint8_t rtype,uint8_t *src,RelocInsert *ri)

{
  char cVar1;
  long x;
  int iVar2;
  ulong uVar3;
  undefined8 *in_RCX;
  void *in_RDX;
  char in_SIL;
  long in_RDI;
  int n;
  lword v;
  lword mask;
  lword data;
  int maxfldsz;
  int be;
  uint local_50;
  lword local_38;
  uint local_30;
  undefined8 *local_28;
  lword local_8;
  
  cVar1 = *(char *)(in_RDI + 0x21a);
  local_30 = 0;
  local_38 = 0;
  for (local_28 = in_RCX; local_28 != (undefined8 *)0x0; local_28 = (undefined8 *)*local_28) {
    x = local_28[2];
    if (x == -1) {
      local_50 = (uint)*(ushort *)((long)local_28 + 10);
    }
    else {
      iVar2 = highest_bit_set(x);
      local_50 = iVar2 + 1;
    }
    if ((int)local_30 < (int)local_50) {
      local_30 = local_50;
    }
    uVar3 = readreloc((uint)(cVar1 != '\0'),in_RDX,(uint)*(ushort *)(local_28 + 1),
                      (uint)*(ushort *)((long)local_28 + 10));
    iVar2 = lshiftcnt(x);
    local_38 = ((x >> ((byte)iVar2 & 0x3f) & uVar3) << ((byte)iVar2 & 0x3f)) + local_38;
  }
  if (((in_SIL == '\n') || (in_SIL == ' ')) || (in_SIL == '!')) {
    local_8 = local_38;
  }
  else {
    local_8 = sign_extend(local_38,local_30);
  }
  return local_8;
}

Assistant:

lword readsection(struct GlobalVars *gv,uint8_t rtype,uint8_t *src,
                  struct RelocInsert *ri)
/* Read data from section at 'src', using the field-offsets, sizes and masks
   from the supplied list of RelocInsert structures. */
{
  int be = gv->endianess != _LITTLE_ENDIAN_;
  int maxfldsz = 0;
  lword data = 0;

  while (ri != NULL) {
    lword mask = ri->mask;
    lword v;
    int n;

    n = mask==-1 ? (int)ri->bsiz : highest_bit_set(mask) + 1;
    if (n > maxfldsz)
      maxfldsz = n;

    /* read from bitfield */
    v = readreloc(be,src,ri->bpos,ri->bsiz);

    /* mask and denormalize the read value using 'mask' */
    n = lshiftcnt(mask);
    mask >>= n;
    v &= mask;
    v <<= n;

    /* add to data value, next RelocInsert */
    data += v;
    ri = ri->next;
  }

  /* sign-extend, when needed */
  if (rtype!=R_SD && rtype!=R_SD2 && rtype!=R_SD21)
    return sign_extend(data,maxfldsz);

  return data;
}